

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O0

void __thiscall
boost::unit_test::output::junit_log_formatter::~junit_log_formatter(junit_log_formatter *this)

{
  junit_log_helper *in_RDI;
  
  (in_RDI->system_out).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&PTR__junit_log_formatter_00301608;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x24860d);
  junit_impl::junit_log_helper::~junit_log_helper(in_RDI);
  std::
  map<unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
  ::~map((map<unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
          *)0x248629);
  unit_test_log_formatter::~unit_test_log_formatter((unit_test_log_formatter *)in_RDI);
  return;
}

Assistant:

junit_log_formatter() : m_display_build_info(false)
    {
        // we log everything from the logger singleton point of view
        // because we need to know about all the messages/commands going to the logger
        // we decide what we put inside the logs internally
        this->m_log_level = log_successful_tests;
        m_log_level_internal = log_messages;
    }